

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::InterfaceVisitor::visit(InterfaceVisitor *this,InterfaceInstantiationStmt *stmt)

{
  InterfaceRef *ref;
  Generator *gen;
  undefined1 local_30 [8];
  shared_ptr<kratos::IDefinition> def;
  
  std::__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)local_30,
             (__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)stmt->interface_);
  ref = stmt->interface_;
  gen = Stmt::generator_parent(&stmt->super_Stmt);
  update_interface_definition(this,(shared_ptr<kratos::IDefinition> *)local_30,ref,gen);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&def);
  return;
}

Assistant:

void visit(InterfaceInstantiationStmt* stmt) override {
        auto def = stmt->interface()->definition();
        update_interface_definition(def, stmt->interface(), stmt->generator_parent());
    }